

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoSimdUnop<unsigned_int,float>(Thread *this,UnopFunc<unsigned_int,_float> *f)

{
  Simd<unsigned_int,_(unsigned_char)__x04_> value;
  float *__first;
  float *__last;
  uint *__result;
  uint local_38 [2];
  SR result;
  Simd<float,_(unsigned_char)__x04_> val;
  UnopFunc<unsigned_int,_float> *f_local;
  Thread *this_local;
  
  join_0x00001240_0x00001200_ = Pop<wabt::interp::Simd<float,(unsigned_char)4>>(this);
  __first = std::begin<float,4ul>((float (*) [4])(result.v + 2));
  __last = std::end<float,4ul>((float (*) [4])(result.v + 2));
  __result = std::begin<unsigned_int,4ul>((uint (*) [4])local_38);
  std::transform<float*,unsigned_int*,unsigned_int(*)(float)>(__first,__last,__result,f);
  value.v[2] = result.v[0];
  value.v[3] = result.v[1];
  value.v[0] = local_38[0];
  value.v[1] = local_38[1];
  Push<wabt::interp::Simd<unsigned_int,(unsigned_char)4>>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdUnop(UnopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  auto val = Pop<ST>();
  SR result;
  std::transform(std::begin(val.v), std::end(val.v), std::begin(result.v), f);
  Push(result);
  return RunResult::Ok;
}